

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBCols64_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x32,int dx)

{
  int j;
  uint32_t *dst;
  uint32_t *src;
  int64_t x;
  int dx_local;
  int x32_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  x = (int64_t)x32;
  dst = (uint32_t *)dst_argb;
  for (j = 0; j < dst_width + -1; j = j + 2) {
    *dst = *(uint32_t *)(src_argb + (x >> 0x10) * 4);
    dst[1] = *(uint32_t *)(src_argb + (dx + x >> 0x10) * 4);
    x = (long)dx + dx + x;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = *(uint32_t *)(src_argb + (x >> 0x10) * 4);
  }
  return;
}

Assistant:

void ScaleARGBCols64_C(uint8_t* dst_argb,
                       const uint8_t* src_argb,
                       int dst_width,
                       int x32,
                       int dx) {
  int64_t x = (int64_t)(x32);
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[0] = src[x >> 16];
    x += dx;
    dst[1] = src[x >> 16];
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[x >> 16];
  }
}